

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseStringLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   *this,UnicodeChar quoteChar)

{
  UTF8Reader *this_00;
  UnicodeChar UVar1;
  UnicodeChar UVar2;
  int iVar3;
  int iVar4;
  CompileMessage local_68;
  
  if ((quoteChar == 0x27) || (quoteChar == 0x22)) {
    this_00 = &this->input;
    UTF8Reader::operator++(this_00);
    std::__cxx11::string::assign((char *)&this->currentStringValue,0);
    while (UVar1 = UTF8Reader::getAndAdvance(this_00), UVar1 != quoteChar) {
      if (UVar1 != 0x5c) goto switchD_001fff5b_caseD_6f;
      UVar1 = UTF8Reader::getAndAdvance(this_00);
      switch(UVar1) {
      case 0x6e:
        UVar2 = 10;
        break;
      case 0x72:
        UVar2 = 0xd;
        break;
      case 0x74:
        UVar2 = 9;
        break;
      case 0x75:
        UVar1 = 0;
        for (iVar4 = -4; iVar4 != 0; iVar4 = iVar4 + 1) {
          UVar2 = UTF8Reader::getAndAdvance(this_00);
          iVar3 = choc::text::hexDigitToInt(UVar2);
          if (iVar3 < 0) {
            (this->location).location.data = (this->input).data;
            Errors::errorInEscapeCode<>();
            (*this->_vptr_Tokeniser[2])(this,&local_68);
            CompileMessage::~CompileMessage(&local_68);
          }
          UVar1 = UVar1 * 0x10 + iVar3;
        }
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_001fff5b_caseD_6f:
        UVar2 = UVar1;
        if (UVar1 == 0) {
          Errors::endOfInputInStringConstant<>();
          (*this->_vptr_Tokeniser[2])(this);
          CompileMessage::~CompileMessage(&local_68);
          UVar2 = 0;
        }
        break;
      default:
        UVar2 = 7;
        if (UVar1 != 0x61) {
          if (UVar1 == 0x62) {
            UVar2 = 8;
          }
          else {
            if (UVar1 != 0x66) goto switchD_001fff5b_caseD_6f;
            UVar2 = 0xc;
          }
        }
      }
      appendUTF8(&this->currentStringValue,UVar2);
    }
    checkCharacterImmediatelyAfterLiteral(this);
  }
  return quoteChar == 0x27 || quoteChar == 0x22;
}

Assistant:

bool parseStringLiteral (UnicodeChar quoteChar)
    {
        if (quoteChar != '"' && quoteChar != '\'')
            return false;

        ++input;
        currentStringValue = {};

        for (;;)
        {
            auto c = input.getAndAdvance();

            if (c == quoteChar)
                break;

            if (c == '\\')
            {
                c = input.getAndAdvance();

                switch (c)
                {
                    case '"':
                    case '\'':
                    case '\\':
                    case '/':  break;

                    case 'a':  c = '\a'; break;
                    case 'b':  c = '\b'; break;
                    case 'f':  c = '\f'; break;
                    case 'n':  c = '\n'; break;
                    case 'r':  c = '\r'; break;
                    case 't':  c = '\t'; break;

                    case 'u':
                    {
                        c = 0;

                        for (int i = 4; --i >= 0;)
                        {
                            auto digitValue = choc::text::hexDigitToInt (input.getAndAdvance());

                            if (digitValue < 0)
                            {
                                location.location = input;
                                throwError (Errors::errorInEscapeCode());
                            }

                            c = (UnicodeChar) ((c << 4) + static_cast<UnicodeChar> (digitValue));
                        }

                        break;
                    }
                }
            }

            if (c == 0)
                throwError (Errors::endOfInputInStringConstant());

            appendUTF8 (currentStringValue, c);
        }

        checkCharacterImmediatelyAfterLiteral();
        return true;
    }